

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O3

ColumnBinding __thiscall
duckdb::TableBinding::GetColumnBinding(TableBinding *this,column_t column_index)

{
  vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *this_00;
  reference pvVar1;
  long lVar2;
  long lVar3;
  size_type sVar4;
  size_type __n;
  size_type sVar5;
  ColumnBinding CVar6;
  column_t local_30;
  
  this_00 = (vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *)
            this->bound_column_ids;
  lVar2 = *(long *)(this_00 + 8);
  sVar4 = lVar2 - *(long *)this_00 >> 5;
  lVar3 = lVar2;
  sVar5 = sVar4;
  local_30 = column_index;
  if (lVar2 != *(long *)this_00) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::ColumnIndex,_true>::operator[]
                         ((vector<duckdb::ColumnIndex,_true> *)this_00,__n);
      lVar2 = *(long *)this_00;
      lVar3 = *(long *)(this_00 + 8);
      sVar5 = __n;
      if (pvVar1->index == column_index) break;
      __n = __n + 1;
      sVar5 = sVar4;
    } while (__n < (ulong)(lVar3 - lVar2 >> 5));
  }
  if (sVar5 == lVar3 - lVar2 >> 5) {
    ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
    emplace_back<unsigned_long&>(this_00,&local_30);
  }
  CVar6.column_index = sVar5;
  CVar6.table_index = (this->super_Binding).index;
  return CVar6;
}

Assistant:

ColumnBinding TableBinding::GetColumnBinding(column_t column_index) {
	auto &column_ids = bound_column_ids;
	ColumnBinding binding;

	// Locate the column_id that matches the 'column_index'
	binding.column_index = column_ids.size();
	for (idx_t i = 0; i < column_ids.size(); ++i) {
		auto &col_id = column_ids[i];
		if (col_id.GetPrimaryIndex() == column_index) {
			binding.column_index = i;
			break;
		}
	}
	// If it wasn't found, add it
	if (binding.column_index == column_ids.size()) {
		column_ids.emplace_back(column_index);
	}

	binding.table_index = index;
	return binding;
}